

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O3

void __thiscall
Transaction_ConstructorGetter_Test::TestBody(Transaction_ConstructorGetter_Test *this)

{
  vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *pvVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  AssertHelperData *pAVar3;
  bool bVar4;
  uint32_t uVar5;
  int32_t iVar6;
  char *pcVar7;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_7;
  Transaction tx;
  AssertionResult gtest_ar_6;
  Transaction empty_tx;
  AssertionResult gtest_ar_5;
  string local_818;
  undefined1 local_7f8 [32];
  Transaction local_7d8;
  ByteData256 local_798;
  Transaction local_780;
  AssertHelper local_740;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_738;
  int local_72c;
  TxOutReference local_728;
  TxOutReference local_6d8;
  TxOutReference local_688;
  TxOutReference local_638;
  TxOutReference local_5e8;
  TxOutReference local_598;
  TxOutReference local_548;
  TxOutReference local_4f8;
  AbstractTxInReference local_4a8;
  AbstractTxInReference local_418;
  AbstractTxInReference local_388;
  AbstractTxInReference local_2f8;
  AbstractTxInReference local_268;
  AbstractTxInReference local_1d8;
  AbstractTxInReference local_148;
  AbstractTxInReference local_b8;
  
  cfd::core::Transaction::Transaction(&local_780);
  local_818._M_dataplus._M_p._0_4_ =
       cfd::core::AbstractTransaction::GetVersion(&local_780.super_AbstractTransaction);
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_7d8,"empty_tx.GetVersion()","exp_version",(int *)&local_818,
             &exp_version);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x35,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::AbstractTransaction::GetLockTime(&local_780.super_AbstractTransaction);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_7d8,"empty_tx.GetLockTime()","exp_locktime",(uint *)&local_818,
             &exp_locktime);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x36,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)&local_7d8,&local_780.super_AbstractTransaction);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_818,"empty_tx.GetHex().c_str()","\"02000000000000000000\"",
             (char *)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction,
             "02000000000000000000");
  pvVar1 = &local_7d8.vin_;
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_7d8.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_7d8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x37,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Transaction::Transaction(&local_7d8,2,0);
  local_7f8._0_4_ = cfd::core::AbstractTransaction::GetVersion(&local_7d8.super_AbstractTransaction)
  ;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_818,"tx.GetVersion()","exp_version",(int *)local_7f8,&exp_version);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x3b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::AbstractTransaction::GetLockTime(&local_7d8.super_AbstractTransaction);
  local_7f8._0_4_ = uVar5;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_818,"tx.GetLockTime()","exp_locktime",(uint *)local_7f8,
             &exp_locktime);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x3c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTransaction::GetHash(&local_798,&local_7d8.super_AbstractTransaction);
  cfd::core::Txid::Txid((Txid *)local_7f8,&local_798);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_818,(Txid *)local_7f8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_740,"Txid(tx.GetHash()).GetHex().c_str()",
             "\"4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a\"",
             local_818._M_dataplus._M_p,
             "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
  paVar2 = &local_818.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != paVar2) {
    operator_delete(local_818._M_dataplus._M_p);
  }
  local_7f8._0_8_ = &PTR__Txid_00678d28;
  if ((pointer)local_7f8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_7f8._8_8_);
  }
  if ((void *)CONCAT44(local_798.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       (uint32_t)
                       local_798.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_798.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (uint32_t)
                                     local_798.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
  }
  if (local_740.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_818);
    if (local_738.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_738.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x3f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_738,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTransaction::GetTxid((Txid *)local_7f8,&local_7d8.super_AbstractTransaction);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_818,(Txid *)local_7f8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_798,"tx.GetTxid().GetHex().c_str()",
             "\"4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a\"",
             local_818._M_dataplus._M_p,
             "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != paVar2) {
    operator_delete(local_818._M_dataplus._M_p);
  }
  local_7f8._0_8_ = &PTR__Txid_00678d28;
  if ((pointer)local_7f8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_7f8._8_8_);
  }
  if (local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_818);
    if (local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_798.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x42,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_818,&local_7d8.super_AbstractTransaction)
  ;
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7f8,"tx.GetHex().c_str()","\"02000000000000000000\"",
             local_818._M_dataplus._M_p,"02000000000000000000");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != paVar2) {
    operator_delete(local_818._M_dataplus._M_p);
  }
  if (local_7f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_818);
    if ((pointer)local_7f8._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_7f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x43,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_7f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  uVar5 = cfd::core::Transaction::GetTotalSize(&local_7d8);
  local_7f8._0_4_ = uVar5;
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_818,"tx.GetTotalSize()","10",(uint *)local_7f8,(int *)&local_798);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x44,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetVsize(&local_7d8);
  local_7f8._0_4_ = uVar5;
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_818,"tx.GetVsize()","10",(uint *)local_7f8,(int *)&local_798);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x45,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetWeight(&local_7d8);
  local_7f8._0_4_ = uVar5;
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x28;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_818,"tx.GetWeight()","40",(uint *)local_7f8,(int *)&local_798);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x46,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetTxInCount(&local_7d8);
  local_7f8._0_4_ = uVar5;
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_818,"tx.GetTxInCount()","0",(uint *)local_7f8,(int *)&local_798);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x47,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetTxOutCount(&local_7d8);
  local_7f8._0_4_ = uVar5;
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_818,"tx.GetTxOutCount()","0",(uint *)local_7f8,(int *)&local_798);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x48,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::core::Transaction::GetTxIn((TxInReference *)&local_b8,&local_7d8,0);
    cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_b8);
  }
  testing::Message::Message((Message *)&local_818);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0x49,
             "Expected: tx.GetTxIn(0) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
  if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
      (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::core::Transaction::GetTxOut(&local_4f8,&local_7d8,0);
    local_4f8.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
         (_func_int **)&PTR__AbstractTxOutReference_0067f008;
    cfd::core::Script::~Script(&local_4f8.super_AbstractTxOutReference.locking_script_);
  }
  testing::Message::Message((Message *)&local_818);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0x4a,
             "Expected: tx.GetTxOut(0) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
  if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
      (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
    }
  }
  bVar4 = cfd::core::Transaction::HasWitness(&local_7d8);
  local_7f8[0] = (internal)bVar4;
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ =
       (uint32_t)
       local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start & 0xffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_818,"tx.HasWitness()","false",(bool *)local_7f8,(bool *)&local_798);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x4b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Transaction::~Transaction(&local_7d8);
  cfd::core::Transaction::~Transaction(&local_780);
  local_7d8.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)pvVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"02000000000000000000","");
  cfd::core::Transaction::Transaction(&local_780,(string *)&local_7d8);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_7d8.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  iVar6 = cfd::core::AbstractTransaction::GetVersion(&local_780.super_AbstractTransaction);
  local_818._M_dataplus._M_p._0_4_ = iVar6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_7d8,"tx.GetVersion()","exp_version",(int *)&local_818,&exp_version);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x51,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::AbstractTransaction::GetLockTime(&local_780.super_AbstractTransaction);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_7d8,"tx.GetLockTime()","exp_locktime",(uint *)&local_818,
             &exp_locktime);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x52,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTransaction::GetHash
            ((ByteData256 *)local_7f8,&local_780.super_AbstractTransaction);
  cfd::core::Txid::Txid((Txid *)&local_818,(ByteData256 *)local_7f8);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_7d8,(Txid *)&local_818);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_798,"Txid(tx.GetHash()).GetHex().c_str()",
             "\"4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a\"",
             (char *)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction,
             "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_7d8.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  local_818._M_dataplus._M_p = (pointer)&PTR__Txid_00678d28;
  if ((undefined8 *)local_818._M_string_length != (undefined8 *)0x0) {
    operator_delete((void *)local_818._M_string_length);
  }
  if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_7f8._0_8_);
  }
  if (local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if (local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_798.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x55,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
          local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
          (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
        (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                     local_7d8.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                    super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTransaction::GetTxid((Txid *)&local_818,&local_780.super_AbstractTransaction);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_7d8,(Txid *)&local_818);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7f8,"tx.GetTxid().GetHex().c_str()",
             "\"4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a\"",
             (char *)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction,
             "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_7d8.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  local_818._M_dataplus._M_p = (pointer)&PTR__Txid_00678d28;
  if ((undefined8 *)local_818._M_string_length != (undefined8 *)0x0) {
    operator_delete((void *)local_818._M_string_length);
  }
  if (local_7f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if ((pointer)local_7f8._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_7f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x58,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
          local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
          (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
        (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                     local_7d8.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                    super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_7f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  uVar5 = cfd::core::Transaction::GetTotalSize(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetTotalSize()","10",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x59,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetVsize(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 10;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetVsize()","10",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x5a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetWeight(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 0x28;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetWeight()","40",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x5b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetTxInCount(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_8_ = local_7f8._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetTxInCount()","0",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x5c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetTxOutCount(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_8_ = local_7f8._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetTxOutCount()","0",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x5d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::core::Transaction::GetTxIn((TxInReference *)&local_148,&local_780,0);
    cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_148);
  }
  testing::Message::Message((Message *)&local_7d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_818,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0x5e,
             "Expected: tx.GetTxIn(0) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
      (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) &&
       ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
      (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                   local_7d8.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                  super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::core::Transaction::GetTxOut(&local_548,&local_780,0);
    local_548.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
         (_func_int **)&PTR__AbstractTxOutReference_0067f008;
    cfd::core::Script::~Script(&local_548.super_AbstractTxOutReference.locking_script_);
  }
  testing::Message::Message((Message *)&local_7d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_818,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0x5f,
             "Expected: tx.GetTxOut(0) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
      (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) &&
       ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
      (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                   local_7d8.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                  super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
    }
  }
  bVar4 = cfd::core::Transaction::HasWitness(&local_780);
  local_818._M_dataplus._M_p._0_1_ = bVar4;
  local_7f8._0_8_ = local_7f8._0_8_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_7d8,"tx.HasWitness()","false",(bool *)&local_818,(bool *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x60,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Transaction::~Transaction(&local_780);
  cfd::core::Transaction::Transaction(&local_780,&exp_tx_witness_abi_cxx11_);
  iVar6 = cfd::core::AbstractTransaction::GetVersion(&local_780.super_AbstractTransaction);
  local_818._M_dataplus._M_p._0_4_ = iVar6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_7d8,"tx.GetVersion()","exp_version",(int *)&local_818,&exp_version);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x67,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::AbstractTransaction::GetLockTime(&local_780.super_AbstractTransaction);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_7d8,"tx.GetLockTime()","exp_locktime",(uint *)&local_818,
             &exp_locktime);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x68,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTransaction::GetWitnessHash
            ((ByteData256 *)local_7f8,&local_780.super_AbstractTransaction);
  cfd::core::Txid::Txid((Txid *)&local_818,(ByteData256 *)local_7f8);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_7d8,(Txid *)&local_818);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_798,"Txid(tx.GetWitnessHash()).GetHex().c_str()",
             "\"7558bcad54a71317d1c9c7c4b60a05e9776723c5fe75011d3042840f9938a32d\"",
             (char *)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction,
             "7558bcad54a71317d1c9c7c4b60a05e9776723c5fe75011d3042840f9938a32d");
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_7d8.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  local_818._M_dataplus._M_p = (pointer)&PTR__Txid_00678d28;
  if ((undefined8 *)local_818._M_string_length != (undefined8 *)0x0) {
    operator_delete((void *)local_818._M_string_length);
  }
  if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_7f8._0_8_);
  }
  if (local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if (local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_798.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x6b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
          local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
          (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
        (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                     local_7d8.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                    super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTransaction::GetTxid((Txid *)&local_818,&local_780.super_AbstractTransaction);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_7d8,(Txid *)&local_818);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7f8,"tx.GetTxid().GetHex().c_str()",
             "\"08e969a2d0a15e906caa60e7327ec725acfd40f6c5bdff108d6a49cd796e1ee7\"",
             (char *)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction,
             "08e969a2d0a15e906caa60e7327ec725acfd40f6c5bdff108d6a49cd796e1ee7");
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_7d8.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  local_818._M_dataplus._M_p = (pointer)&PTR__Txid_00678d28;
  if ((undefined8 *)local_818._M_string_length != (undefined8 *)0x0) {
    operator_delete((void *)local_818._M_string_length);
  }
  if (local_7f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if ((pointer)local_7f8._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_7f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x6e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
          local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
          (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
        (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                     local_7d8.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                    super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_7f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  uVar5 = cfd::core::Transaction::GetTotalSize(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 0xf7;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetTotalSize()","247",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x6f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetVsize(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 0xa6;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetVsize()","166",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x70,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetWeight(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 0x295;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetWeight()","661",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x71,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::Transaction::GetTxIn((TxInReference *)&local_1d8,&local_780,0);
      cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_1d8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_7d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x72,"Expected: tx.GetTxIn(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
          local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
          (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
        (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                     local_7d8.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                    super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::core::Transaction::GetTxIn((TxInReference *)&local_268,&local_780,1);
    cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_268);
  }
  testing::Message::Message((Message *)&local_7d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_818,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0x73,
             "Expected: tx.GetTxIn(1) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
      (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) &&
       ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
        local_7d8.super_AbstractTransaction._vptr_AbstractTransaction !=
        (vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)0x0)) {
      (*(code *)(((((_Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
                   local_7d8.super_AbstractTransaction._vptr_AbstractTransaction)->_M_impl).
                  super__Vector_impl_data._M_start)->super_AbstractTxIn).txid_._vptr_Txid)();
    }
  }
  local_818._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_818,"8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1"
             ,"");
  cfd::core::Txid::Txid((Txid *)&local_7d8,&local_818);
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ =
       cfd::core::Transaction::GetTxInIndex(&local_780,(Txid *)&local_7d8,0);
  local_740.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_7f8,
             "tx.GetTxInIndex( Txid( \"8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1\"), 0)"
             ,"0",(uint *)&local_798,(int *)&local_740);
  local_7d8.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)&PTR__Txid_00678d28;
  if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ != (undefined8 *)0x0) {
    operator_delete(local_7d8.super_AbstractTransaction.wally_tx_pointer_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != paVar2) {
    operator_delete(local_818._M_dataplus._M_p);
  }
  if (local_7f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if ((pointer)local_7f8._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_7f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x79,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_7f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_818._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_818,
               "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1","");
    cfd::core::Txid::Txid((Txid *)&local_7d8,&local_818);
    cfd::core::Transaction::GetTxInIndex(&local_780,(Txid *)&local_7d8,1);
    local_7d8.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&PTR__Txid_00678d28;
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ != (undefined8 *)0x0) {
      operator_delete(local_7d8.super_AbstractTransaction.wally_tx_pointer_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_818._M_dataplus._M_p != paVar2) {
      operator_delete(local_818._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_7d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_818,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0x7f,
             "Expected: tx.GetTxInIndex( Txid( \"8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1\"), 1) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
  if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) &&
       (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
      (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
    }
  }
  uVar5 = cfd::core::Transaction::GetTxInCount(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetTxInCount()","1",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x80,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::Transaction::GetTxInList
                ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                 &local_7d8,&local_780);
      std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
                ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                 &local_7d8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_7d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x81,
               "Expected: std::vector<TxInReference> txins = tx.GetTxInList() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  uVar5 = cfd::core::Transaction::GetScriptWitnessStackNum(&local_780,0);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetScriptWitnessStackNum(0)","2",(uint *)&local_818,
             (int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x82,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetTxOutCount(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetTxOutCount()","2",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x83,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::Transaction::GetTxOutList
                ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                 &local_7d8,&local_780);
      std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
                ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                 &local_7d8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_7d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x84,
               "Expected: std::vector<TxOutReference> txouts = tx.GetTxOutList() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::Transaction::GetTxOut(&local_598,&local_780,0);
      local_598.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
           (_func_int **)&PTR__AbstractTxOutReference_0067f008;
      cfd::core::Script::~Script(&local_598.super_AbstractTxOutReference.locking_script_);
    }
  }
  else {
    testing::Message::Message((Message *)&local_7d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x85,"Expected: tx.GetTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  local_818._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_818,"a9142699570770f32e0cf3e1d12d81064fbc45899e8a87","");
  cfd::core::Script::Script((Script *)&local_7d8,&local_818);
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ =
       cfd::core::Transaction::GetTxOutIndex(&local_780,(Script *)&local_7d8);
  local_740.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_7f8,
             "tx.GetTxOutIndex(Script(\"a9142699570770f32e0cf3e1d12d81064fbc45899e8a87\"))","1",
             (uint *)&local_798,(int *)&local_740);
  cfd::core::Script::~Script((Script *)&local_7d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != paVar2) {
    operator_delete(local_818._M_dataplus._M_p);
  }
  if (local_7f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if ((pointer)local_7f8._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_7f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x88,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_7f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::core::Transaction::GetTxOut(&local_5e8,&local_780,2);
    local_5e8.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
         (_func_int **)&PTR__AbstractTxOutReference_0067f008;
    cfd::core::Script::~Script(&local_5e8.super_AbstractTxOutReference.locking_script_);
  }
  testing::Message::Message((Message *)&local_7d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_818,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0x89,
             "Expected: tx.GetTxOut(2) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
  if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) &&
       (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
      (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
    }
  }
  uVar5 = cfd::core::Transaction::GetWallyFlag(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetWallyFlag()","1",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x8a,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = cfd::core::Transaction::HasWitness(&local_780);
  local_818._M_dataplus._M_p._0_1_ = bVar4;
  local_7f8[0] = (internal)0x1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_7d8,"tx.HasWitness()","true",(bool *)&local_818,(bool *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x8b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_818._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_818._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_818._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_818,"a9142699570970f32e0cf3e1d12d81064fbc45899e8a87","");
    cfd::core::Script::Script((Script *)&local_7d8,&local_818);
    cfd::core::Transaction::GetTxOutIndex(&local_780,(Script *)&local_7d8);
    cfd::core::Script::~Script((Script *)&local_7d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_818._M_dataplus._M_p != paVar2) {
      operator_delete(local_818._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_7d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_818,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0x8e,
             "Expected: tx.GetTxOutIndex(Script(\"a9142699570970f32e0cf3e1d12d81064fbc45899e8a87\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
  if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) &&
       (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
      (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
    }
  }
  cfd::core::Transaction::~Transaction(&local_780);
  cfd::core::ByteData::ByteData((ByteData *)&local_818,&exp_tx_witness_abi_cxx11_);
  cfd::core::Transaction::Transaction(&local_780,(ByteData *)&local_818);
  cfd::core::AbstractTransaction::GetData
            ((ByteData *)local_7f8,&local_780.super_AbstractTransaction);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)&local_7d8,(ByteData *)local_7f8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_798,"data.GetHex().c_str()","exp_tx_witness.c_str()",
             (char *)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction,
             exp_tx_witness_abi_cxx11_._M_dataplus._M_p);
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_7d8.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  if (local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if (local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_798.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_740,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x95,pcVar7);
    testing::internal::AssertHelper::operator=(&local_740,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_740);
    if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_7f8._0_8_);
  }
  cfd::core::Transaction::~Transaction(&local_780);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_818._M_dataplus._M_p);
  }
  cfd::core::Transaction::Transaction(&local_780,&exp_tx_legacy_abi_cxx11_);
  iVar6 = cfd::core::AbstractTransaction::GetVersion(&local_780.super_AbstractTransaction);
  local_818._M_dataplus._M_p._0_4_ = iVar6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_7d8,"tx.GetVersion()","exp_version",(int *)&local_818,&exp_version);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x9b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::AbstractTransaction::GetLockTime(&local_780.super_AbstractTransaction);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_7d8,"tx.GetLockTime()","exp_locktime",(uint *)&local_818,
             &exp_locktime);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x9c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTransaction::GetHash
            ((ByteData256 *)local_7f8,&local_780.super_AbstractTransaction);
  cfd::core::Txid::Txid((Txid *)&local_818,(ByteData256 *)local_7f8);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_7d8,(Txid *)&local_818);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_798,"Txid(tx.GetHash()).GetHex().c_str()",
             "\"85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590\"",
             (char *)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction,
             "85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590");
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_7d8.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  local_818._M_dataplus._M_p = (pointer)&PTR__Txid_00678d28;
  if ((undefined8 *)local_818._M_string_length != (undefined8 *)0x0) {
    operator_delete((void *)local_818._M_string_length);
  }
  if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_7f8._0_8_);
  }
  if (local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if (local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_798.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0x9f,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTransaction::GetTxid((Txid *)&local_818,&local_780.super_AbstractTransaction);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)&local_7d8,(Txid *)&local_818);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_7f8,"tx.GetTxid().GetHex().c_str()",
             "\"85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590\"",
             (char *)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction,
             "85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590");
  if ((vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_> *)
      local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != pvVar1) {
    operator_delete(local_7d8.super_AbstractTransaction._vptr_AbstractTransaction);
  }
  local_818._M_dataplus._M_p = (pointer)&PTR__Txid_00678d28;
  if ((undefined8 *)local_818._M_string_length != (undefined8 *)0x0) {
    operator_delete((void *)local_818._M_string_length);
  }
  if (local_7f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if ((pointer)local_7f8._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_7f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xa2,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_7f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  uVar5 = cfd::core::Transaction::GetTotalSize(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 0xbd;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetTotalSize()","189",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xa3,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetVsize(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 0xbd;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetVsize()","189",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xa4,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetWeight(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 0x2f4;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetWeight()","756",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xa5,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::Transaction::GetTxIn((TxInReference *)&local_2f8,&local_780,0);
      cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_2f8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_7d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xa6,"Expected: tx.GetTxIn(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::core::Transaction::GetTxIn((TxInReference *)&local_388,&local_780,1);
    cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_388);
  }
  testing::Message::Message((Message *)&local_7d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_818,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0xa7,
             "Expected: tx.GetTxIn(1) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
  if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) &&
       (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
      (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
    }
  }
  local_818._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_818,"405e51d745c9f534a71c9e4563521b832fedcbda65c6da2db502e8e236ead2c6"
             ,"");
  cfd::core::Txid::Txid((Txid *)&local_7d8,&local_818);
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ =
       cfd::core::Transaction::GetTxInIndex(&local_780,(Txid *)&local_7d8,0);
  local_740.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)local_7f8,
             "tx.GetTxInIndex( Txid( \"405e51d745c9f534a71c9e4563521b832fedcbda65c6da2db502e8e236ead2c6\"), 0)"
             ,"0",(uint *)&local_798,(int *)&local_740);
  local_7d8.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)&PTR__Txid_00678d28;
  if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ != (undefined8 *)0x0) {
    operator_delete(local_7d8.super_AbstractTransaction.wally_tx_pointer_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != paVar2) {
    operator_delete(local_818._M_dataplus._M_p);
  }
  if (local_7f8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_7d8);
    if ((pointer)local_7f8._8_8_ == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_7f8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xad,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_7f8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_818._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_818,
               "405e51d745c9f534a71c9e4563521b832fedcbda65c6da2db502e8e236ead2c6","");
    cfd::core::Txid::Txid((Txid *)&local_7d8,&local_818);
    cfd::core::Transaction::GetTxInIndex(&local_780,(Txid *)&local_7d8,1);
    local_7d8.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&PTR__Txid_00678d28;
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ != (undefined8 *)0x0) {
      operator_delete(local_7d8.super_AbstractTransaction.wally_tx_pointer_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_818._M_dataplus._M_p != paVar2) {
      operator_delete(local_818._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_7d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_818,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0xb3,
             "Expected: tx.GetTxInIndex( Txid( \"405e51d745c9f534a71c9e4563521b832fedcbda65c6da2db502e8e236ead2c6\"), 1) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
  if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) &&
       (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
      (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
    }
  }
  uVar5 = cfd::core::Transaction::GetTxInCount(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetTxInCount()","1",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xb4,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::Transaction::GetTxInList
                ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                 &local_7d8,&local_780);
      std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
                ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                 &local_7d8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_7d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xb5,
               "Expected: std::vector<TxInReference> txins = tx.GetTxInList() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  uVar5 = cfd::core::Transaction::GetScriptWitnessStackNum(&local_780,0);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_8_ = local_7f8._0_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetScriptWitnessStackNum(0)","0",(uint *)&local_818,
             (int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xb6,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetTxOutCount(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetTxOutCount()","1",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xb7,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::Transaction::GetTxOutList
                ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                 &local_7d8,&local_780);
      std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
                ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                 &local_7d8);
    }
  }
  else {
    testing::Message::Message((Message *)&local_7d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xb8,
               "Expected: std::vector<TxOutReference> txouts = tx.GetTxOutList() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::Transaction::GetTxOut(&local_638,&local_780,0);
      local_638.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
           (_func_int **)&PTR__AbstractTxOutReference_0067f008;
      cfd::core::Script::~Script(&local_638.super_AbstractTxOutReference.locking_script_);
    }
  }
  else {
    testing::Message::Message((Message *)&local_7d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xb9,"Expected: tx.GetTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
    if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
        (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::core::Transaction::GetTxOut(&local_688,&local_780,1);
    local_688.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
         (_func_int **)&PTR__AbstractTxOutReference_0067f008;
    cfd::core::Script::~Script(&local_688.super_AbstractTxOutReference.locking_script_);
  }
  testing::Message::Message((Message *)&local_7d8);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_818,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0xba,
             "Expected: tx.GetTxOut(1) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_818,(Message *)&local_7d8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_818);
  if (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) &&
       (local_7d8.super_AbstractTransaction._vptr_AbstractTransaction != (_func_int **)0x0)) {
      (**(code **)(*local_7d8.super_AbstractTransaction._vptr_AbstractTransaction + 8))();
    }
  }
  uVar5 = cfd::core::Transaction::GetWallyFlag(&local_780);
  local_818._M_dataplus._M_p._0_4_ = uVar5;
  local_7f8._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_7d8,"tx.GetWallyFlag()","1",(uint *)&local_818,(int *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xbb,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = cfd::core::Transaction::HasWitness(&local_780);
  local_818._M_dataplus._M_p._0_1_ = bVar4;
  local_7f8._0_8_ = local_7f8._0_8_ & 0xffffffffffffff00;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_7d8,"tx.HasWitness()","false",(bool *)&local_818,(bool *)local_7f8);
  if ((char)local_7d8.super_AbstractTransaction._vptr_AbstractTransaction == '\0') {
    testing::Message::Message((Message *)&local_818);
    if ((undefined8 *)local_7d8.super_AbstractTransaction.wally_tx_pointer_ == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *local_7d8.super_AbstractTransaction.wally_tx_pointer_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xbc,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7d8.super_AbstractTransaction.wally_tx_pointer_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Transaction::~Transaction(&local_780);
  cfd::core::Transaction::Transaction(&local_780,&exp_tx_witness_abi_cxx11_);
  cfd::core::Transaction::Transaction(&local_7d8,&local_780);
  iVar6 = cfd::core::AbstractTransaction::GetVersion(&local_7d8.super_AbstractTransaction);
  local_7f8._0_4_ = iVar6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_818,"tx.GetVersion()","exp_version",(int *)local_7f8,&exp_version);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xc4,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::AbstractTransaction::GetLockTime(&local_7d8.super_AbstractTransaction);
  local_7f8._0_4_ = uVar5;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)&local_818,"tx.GetLockTime()","exp_locktime",(uint *)local_7f8,
             &exp_locktime);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xc5,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTransaction::GetWitnessHash(&local_798,&local_7d8.super_AbstractTransaction);
  cfd::core::Txid::Txid((Txid *)local_7f8,&local_798);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_818,(Txid *)local_7f8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_740,"Txid(tx.GetWitnessHash()).GetHex().c_str()",
             "\"7558bcad54a71317d1c9c7c4b60a05e9776723c5fe75011d3042840f9938a32d\"",
             local_818._M_dataplus._M_p,
             "7558bcad54a71317d1c9c7c4b60a05e9776723c5fe75011d3042840f9938a32d");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != paVar2) {
    operator_delete(local_818._M_dataplus._M_p);
  }
  local_7f8._0_8_ = &PTR__Txid_00678d28;
  if ((pointer)local_7f8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_7f8._8_8_);
  }
  if ((void *)CONCAT44(local_798.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start._4_4_,
                       (uint32_t)
                       local_798.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_798.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (uint32_t)
                                     local_798.data_.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
  }
  if (local_740.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_818);
    if (local_738.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar7 = "";
    }
    else {
      pcVar7 = ((local_738.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,200,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_738,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTransaction::GetTxid((Txid *)local_7f8,&local_7d8.super_AbstractTransaction);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_818,(Txid *)local_7f8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_798,"tx.GetTxid().GetHex().c_str()",
             "\"08e969a2d0a15e906caa60e7327ec725acfd40f6c5bdff108d6a49cd796e1ee7\"",
             local_818._M_dataplus._M_p,
             "08e969a2d0a15e906caa60e7327ec725acfd40f6c5bdff108d6a49cd796e1ee7");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != paVar2) {
    operator_delete(local_818._M_dataplus._M_p);
  }
  local_7f8._0_8_ = &PTR__Txid_00678d28;
  if ((pointer)local_7f8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_7f8._8_8_);
  }
  if (local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_818);
    if (local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_798.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xcb,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetTotalSize(&local_7d8);
  local_7f8._0_4_ = uVar5;
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xf7;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_818,"tx.GetTotalSize()","247",(uint *)local_7f8,(int *)&local_798);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xcc,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetVsize(&local_7d8);
  local_7f8._0_4_ = uVar5;
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xa6;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_818,"tx.GetVsize()","166",(uint *)local_7f8,(int *)&local_798);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xcd,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetWeight(&local_7d8);
  local_7f8._0_4_ = uVar5;
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x295;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_818,"tx.GetWeight()","661",(uint *)local_7f8,(int *)&local_798);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xce,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::Transaction::GetTxIn((TxInReference *)&local_418,&local_7d8,0);
      cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_418);
    }
  }
  else {
    testing::Message::Message((Message *)&local_818);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xcf,"Expected: tx.GetTxIn(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::core::Transaction::GetTxIn((TxInReference *)&local_4a8,&local_7d8,1);
    cfd::core::AbstractTxInReference::~AbstractTxInReference(&local_4a8);
  }
  testing::Message::Message((Message *)&local_818);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0xd0,
             "Expected: tx.GetTxIn(1) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
  if ((long *)local_818._M_dataplus._M_p != (long *)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && ((long *)local_818._M_dataplus._M_p != (long *)0x0)) {
      (**(code **)(*(long *)local_818._M_dataplus._M_p + 8))();
    }
  }
  pAVar3 = (AssertHelperData *)(local_7f8 + 0x10);
  local_7f8._0_8_ = pAVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7f8,"8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1",
             "");
  cfd::core::Txid::Txid((Txid *)&local_818,(string *)local_7f8);
  local_740.data_._0_4_ = cfd::core::Transaction::GetTxInIndex(&local_7d8,(Txid *)&local_818,0);
  local_72c = 0;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_798,
             "tx.GetTxInIndex( Txid( \"8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1\"), 0)"
             ,"0",(uint *)&local_740,&local_72c);
  local_818._M_dataplus._M_p = (pointer)&PTR__Txid_00678d28;
  if ((undefined8 *)local_818._M_string_length != (undefined8 *)0x0) {
    operator_delete((void *)local_818._M_string_length);
  }
  if ((AssertHelperData *)local_7f8._0_8_ != pAVar3) {
    operator_delete((void *)local_7f8._0_8_);
  }
  if (local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_818);
    if (local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish == (pointer)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_798.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xd6,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((undefined **)local_818._M_dataplus._M_p != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_818._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    local_7f8._0_8_ = pAVar3;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7f8,
               "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1","");
    cfd::core::Txid::Txid((Txid *)&local_818,(string *)local_7f8);
    cfd::core::Transaction::GetTxInIndex(&local_7d8,(Txid *)&local_818,1);
    local_818._M_dataplus._M_p = (pointer)&PTR__Txid_00678d28;
    if ((undefined8 *)local_818._M_string_length != (undefined8 *)0x0) {
      operator_delete((void *)local_818._M_string_length);
    }
    if ((AssertHelperData *)local_7f8._0_8_ != pAVar3) {
      operator_delete((void *)local_7f8._0_8_);
    }
  }
  testing::Message::Message((Message *)&local_818);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0xdc,
             "Expected: tx.GetTxInIndex( Txid( \"8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1\"), 1) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
  if ((undefined **)local_818._M_dataplus._M_p != (undefined **)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && ((undefined **)local_818._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_818._M_dataplus._M_p + 8))();
    }
  }
  uVar5 = cfd::core::Transaction::GetTxInCount(&local_7d8);
  local_7f8._0_4_ = uVar5;
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_818,"tx.GetTxInCount()","1",(uint *)local_7f8,(int *)&local_798);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xdd,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::Transaction::GetTxInList
                ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                 &local_818,&local_7d8);
      std::vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_>::~vector
                ((vector<cfd::core::TxInReference,_std::allocator<cfd::core::TxInReference>_> *)
                 &local_818);
    }
  }
  else {
    testing::Message::Message((Message *)&local_818);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xde,
               "Expected: std::vector<TxInReference> txins = tx.GetTxInList() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((undefined **)local_818._M_dataplus._M_p != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_818._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  uVar5 = cfd::core::Transaction::GetScriptWitnessStackNum(&local_7d8,0);
  local_7f8._0_4_ = uVar5;
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_818,"tx.GetScriptWitnessStackNum(0)","2",(uint *)local_7f8,
             (int *)&local_798);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xdf,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar5 = cfd::core::Transaction::GetTxOutCount(&local_7d8);
  local_7f8._0_4_ = uVar5;
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 2;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_818,"tx.GetTxOutCount()","2",(uint *)local_7f8,(int *)&local_798);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xe0,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::Transaction::GetTxOutList
                ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                 &local_818,&local_7d8);
      std::vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_>::~vector
                ((vector<cfd::core::TxOutReference,_std::allocator<cfd::core::TxOutReference>_> *)
                 &local_818);
    }
  }
  else {
    testing::Message::Message((Message *)&local_818);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xe1,
               "Expected: std::vector<TxOutReference> txouts = tx.GetTxOutList() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((undefined **)local_818._M_dataplus._M_p != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_818._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::Transaction::GetTxOut(&local_6d8,&local_7d8,0);
      local_6d8.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
           (_func_int **)&PTR__AbstractTxOutReference_0067f008;
      cfd::core::Script::~Script(&local_6d8.super_AbstractTxOutReference.locking_script_);
    }
  }
  else {
    testing::Message::Message((Message *)&local_818);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_7f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xe2,"Expected: tx.GetTxOut(0) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
    if ((undefined **)local_818._M_dataplus._M_p != (undefined **)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((undefined **)local_818._M_dataplus._M_p != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_818._M_dataplus._M_p + 8))();
      }
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    cfd::core::Transaction::GetTxOut(&local_728,&local_7d8,2);
    local_728.super_AbstractTxOutReference._vptr_AbstractTxOutReference =
         (_func_int **)&PTR__AbstractTxOutReference_0067f008;
    cfd::core::Script::~Script(&local_728.super_AbstractTxOutReference.locking_script_);
  }
  testing::Message::Message((Message *)&local_818);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)local_7f8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
             ,0xe3,
             "Expected: tx.GetTxOut(2) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)local_7f8,(Message *)&local_818);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_7f8);
  if ((undefined **)local_818._M_dataplus._M_p != (undefined **)0x0) {
    bVar4 = testing::internal::IsTrue(true);
    if ((bVar4) && ((undefined **)local_818._M_dataplus._M_p != (undefined **)0x0)) {
      (**(code **)(*(undefined **)local_818._M_dataplus._M_p + 8))();
    }
  }
  uVar5 = cfd::core::Transaction::GetWallyFlag(&local_7d8);
  local_7f8._0_4_ = uVar5;
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&local_818,"tx.GetWallyFlag()","1",(uint *)local_7f8,(int *)&local_798);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xe4,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar4 = cfd::core::Transaction::HasWitness(&local_7d8);
  local_7f8[0] = (internal)bVar4;
  local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ =
       CONCAT31(local_798.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start._1_3_,1);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_818,"tx.HasWitness()","true",(bool *)local_7f8,(bool *)&local_798);
  if ((char)local_818._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_7f8);
    if ((undefined8 *)local_818._M_string_length == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_818._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_transaction.cpp"
               ,0xe5,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_798,(Message *)local_7f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_798);
    if ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_7f8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_7f8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_818._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Transaction::~Transaction(&local_7d8);
  cfd::core::Transaction::~Transaction(&local_780);
  return;
}

Assistant:

TEST(Transaction, ConstructorGetter) {
  {
    Transaction empty_tx;
    EXPECT_EQ(empty_tx.GetVersion(), exp_version);
    EXPECT_EQ(empty_tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(empty_tx.GetHex().c_str(), "02000000000000000000");

    // new transaction
    Transaction tx(exp_version, exp_locktime);
    EXPECT_EQ(tx.GetVersion(), exp_version);
    EXPECT_EQ(tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(
        Txid(tx.GetHash()).GetHex().c_str(),
        "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
    EXPECT_STREQ(
        tx.GetTxid().GetHex().c_str(),
        "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
    EXPECT_STREQ(tx.GetHex().c_str(), "02000000000000000000");
    EXPECT_EQ(tx.GetTotalSize(), 10);
    EXPECT_EQ(tx.GetVsize(), 10);
    EXPECT_EQ(tx.GetWeight(), 40);
    EXPECT_EQ(tx.GetTxInCount(), 0);
    EXPECT_EQ(tx.GetTxOutCount(), 0);
    EXPECT_THROW(tx.GetTxIn(0), CfdException);
    EXPECT_THROW(tx.GetTxOut(0), CfdException);
    EXPECT_EQ(tx.HasWitness(), false);
  }

  {
    // hex to transaction(empty)
    Transaction tx("02000000000000000000");
    EXPECT_EQ(tx.GetVersion(), exp_version);
    EXPECT_EQ(tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(
        Txid(tx.GetHash()).GetHex().c_str(),
        "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
    EXPECT_STREQ(
        tx.GetTxid().GetHex().c_str(),
        "4ebd325a4b394cff8c57e8317ccf5a8d0e2bdf1b8526f8aad6c8e43d8240621a");
    EXPECT_EQ(tx.GetTotalSize(), 10);
    EXPECT_EQ(tx.GetVsize(), 10);
    EXPECT_EQ(tx.GetWeight(), 40);
    EXPECT_EQ(tx.GetTxInCount(), 0);
    EXPECT_EQ(tx.GetTxOutCount(), 0);
    EXPECT_THROW(tx.GetTxIn(0), CfdException);
    EXPECT_THROW(tx.GetTxOut(0), CfdException);
    EXPECT_EQ(tx.HasWitness(), false);
  }

  {
    // hex to transaction(witness)
    Transaction tx(exp_tx_witness);

    EXPECT_EQ(tx.GetVersion(), exp_version);
    EXPECT_EQ(tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(
        Txid(tx.GetWitnessHash()).GetHex().c_str(),
        "7558bcad54a71317d1c9c7c4b60a05e9776723c5fe75011d3042840f9938a32d");
    EXPECT_STREQ(
        tx.GetTxid().GetHex().c_str(),
        "08e969a2d0a15e906caa60e7327ec725acfd40f6c5bdff108d6a49cd796e1ee7");
    EXPECT_EQ(tx.GetTotalSize(), 247);
    EXPECT_EQ(tx.GetVsize(), 166);
    EXPECT_EQ(tx.GetWeight(), 661);
    EXPECT_NO_THROW(tx.GetTxIn(0));
    EXPECT_THROW(tx.GetTxIn(1), CfdException);
    EXPECT_EQ(
        tx.GetTxInIndex(
            Txid(
                "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1"),
            0),
        0);
    EXPECT_THROW(
        tx.GetTxInIndex(
            Txid(
                "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1"),
            1),
        CfdException);
    EXPECT_EQ(tx.GetTxInCount(), 1);
    EXPECT_NO_THROW(std::vector<TxInReference> txins = tx.GetTxInList());
    EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 2);
    EXPECT_EQ(tx.GetTxOutCount(), 2);
    EXPECT_NO_THROW(std::vector<TxOutReference> txouts = tx.GetTxOutList());
    EXPECT_NO_THROW(tx.GetTxOut(0));
    EXPECT_EQ(
        tx.GetTxOutIndex(Script("a9142699570770f32e0cf3e1d12d81064fbc45899e8a87")),
        1);
    EXPECT_THROW(tx.GetTxOut(2), CfdException);
    EXPECT_EQ(tx.GetWallyFlag(), 1);
    EXPECT_EQ(tx.HasWitness(), true);
    EXPECT_THROW(
        tx.GetTxOutIndex(Script("a9142699570970f32e0cf3e1d12d81064fbc45899e8a87")),
        CfdException);
  }

  {
    ByteData exp_data = ByteData(exp_tx_witness);
    Transaction tx_b(exp_data);
    ByteData data = tx_b.GetData();
    EXPECT_STREQ(data.GetHex().c_str(), exp_tx_witness.c_str());
  }

  {
    // hex to transaction(legacy)
    Transaction tx(exp_tx_legacy);
    EXPECT_EQ(tx.GetVersion(), exp_version);
    EXPECT_EQ(tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(
        Txid(tx.GetHash()).GetHex().c_str(),
        "85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590");
    EXPECT_STREQ(
        tx.GetTxid().GetHex().c_str(),
        "85a37a01f7924c7ee95e948274c306fee1b6a0731722da5039c900d43561a590");
    EXPECT_EQ(tx.GetTotalSize(), 189);
    EXPECT_EQ(tx.GetVsize(), 189);
    EXPECT_EQ(tx.GetWeight(), 756);
    EXPECT_NO_THROW(tx.GetTxIn(0));
    EXPECT_THROW(tx.GetTxIn(1), CfdException);
    EXPECT_EQ(
        tx.GetTxInIndex(
            Txid(
                "405e51d745c9f534a71c9e4563521b832fedcbda65c6da2db502e8e236ead2c6"),
            0),
        0);
    EXPECT_THROW(
        tx.GetTxInIndex(
            Txid(
                "405e51d745c9f534a71c9e4563521b832fedcbda65c6da2db502e8e236ead2c6"),
            1),
        CfdException);
    EXPECT_EQ(tx.GetTxInCount(), 1);
    EXPECT_NO_THROW(std::vector<TxInReference> txins = tx.GetTxInList());
    EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 0);
    EXPECT_EQ(tx.GetTxOutCount(), 1);
    EXPECT_NO_THROW(std::vector<TxOutReference> txouts = tx.GetTxOutList());
    EXPECT_NO_THROW(tx.GetTxOut(0));
    EXPECT_THROW(tx.GetTxOut(1), CfdException);
    EXPECT_EQ(tx.GetWallyFlag(), 1);
    EXPECT_EQ(tx.HasWitness(), false);
  }

  {
    // copy constructor
    Transaction copy_tx(exp_tx_witness);
    Transaction tx(copy_tx);

    EXPECT_EQ(tx.GetVersion(), exp_version);
    EXPECT_EQ(tx.GetLockTime(), exp_locktime);
    EXPECT_STREQ(
        Txid(tx.GetWitnessHash()).GetHex().c_str(),
        "7558bcad54a71317d1c9c7c4b60a05e9776723c5fe75011d3042840f9938a32d");
    EXPECT_STREQ(
        tx.GetTxid().GetHex().c_str(),
        "08e969a2d0a15e906caa60e7327ec725acfd40f6c5bdff108d6a49cd796e1ee7");
    EXPECT_EQ(tx.GetTotalSize(), 247);
    EXPECT_EQ(tx.GetVsize(), 166);
    EXPECT_EQ(tx.GetWeight(), 661);
    EXPECT_NO_THROW(tx.GetTxIn(0));
    EXPECT_THROW(tx.GetTxIn(1), CfdException);
    EXPECT_EQ(
        tx.GetTxInIndex(
            Txid(
                "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1"),
            0),
        0);
    EXPECT_THROW(
        tx.GetTxInIndex(
            Txid(
                "8b84fd7266e1ec09cb5a27cd032729be0102178e250645ee429518e7e83f99f1"),
            1),
        CfdException);
    EXPECT_EQ(tx.GetTxInCount(), 1);
    EXPECT_NO_THROW(std::vector<TxInReference> txins = tx.GetTxInList());
    EXPECT_EQ(tx.GetScriptWitnessStackNum(0), 2);
    EXPECT_EQ(tx.GetTxOutCount(), 2);
    EXPECT_NO_THROW(std::vector<TxOutReference> txouts = tx.GetTxOutList());
    EXPECT_NO_THROW(tx.GetTxOut(0));
    EXPECT_THROW(tx.GetTxOut(2), CfdException);
    EXPECT_EQ(tx.GetWallyFlag(), 1);
    EXPECT_EQ(tx.HasWitness(), true);
  }
}